

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

string * __thiscall
glcts::TessellationShaderTessellationInputPatchDiscard::getTECode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderTessellationInputPatchDiscard *this,
          _tessellation_primitive_mode primitive_mode)

{
  ulong uVar1;
  _tessellation_primitive_mode primitive_mode_00;
  string primitive_mode_string;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(PRIMITIVE_MODE) in;\n\nin  int   tc_primitive_id   [];\nout ivec2 te_tc_primitive_id;\nout int   te_primitive_id;\n\nvoid main()\n{\n    te_tc_primitive_id[0] = tc_primitive_id[0];\n    te_tc_primitive_id[1] = tc_primitive_id[1];\n    te_primitive_id       = gl_PrimitiveID;\n}\n"
             ,(allocator<char> *)&primitive_mode_string);
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            (&primitive_mode_string,(TessellationShaderUtils *)(ulong)primitive_mode,
             primitive_mode_00);
  while( true ) {
    uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x177a06a);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,(string *)0xe);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((char *)__return_storage_ptr__,0x177a06a);
  }
  std::__cxx11::string::~string((string *)&primitive_mode_string);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTessellationInputPatchDiscard::getTECode(_tessellation_primitive_mode primitive_mode)
{
	std::string result = "${VERSION}\n"
						 "\n"
						 "${TESSELLATION_SHADER_REQUIRE}\n"
						 "\n"
						 "layout(PRIMITIVE_MODE) in;\n"
						 "\n"
						 "in  int   tc_primitive_id   [];\n"
						 "out ivec2 te_tc_primitive_id;\n"
						 "out int   te_primitive_id;\n"
						 "\n"
						 "void main()\n"
						 "{\n"
						 "    te_tc_primitive_id[0] = tc_primitive_id[0];\n"
						 "    te_tc_primitive_id[1] = tc_primitive_id[1];\n"
						 "    te_primitive_id       = gl_PrimitiveID;\n"
						 "}\n";

	/* Replace PRIMITIVE_MODE token with actual primitive_mode */
	std::string primitive_mode_string	  = TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
	const char* primitive_mode_token	   = "PRIMITIVE_MODE";
	std::size_t primitive_mode_token_index = std::string::npos;

	while ((primitive_mode_token_index = result.find(primitive_mode_token)) != std::string::npos)
	{
		result = result.replace(primitive_mode_token_index, strlen(primitive_mode_token), primitive_mode_string);

		primitive_mode_token_index = result.find(primitive_mode_token);
	}

	/* Done */
	return result;
}